

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_network.cpp
# Opt level: O0

void __thiscall NeuralNetwork::backPropagation(NeuralNetwork *this,VectorXf *y)

{
  int *in_RDI;
  Product<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_Eigen::Transpose<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_0>
  PVar1;
  Product<Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>
  PVar2;
  VectorXf temp1;
  value_type *nextLayer;
  value_type *layer;
  int i;
  VectorXf temp;
  VectorXf *lastOutput;
  DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>_>
  *in_stack_fffffffffffffcf8;
  MatrixBase<Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_> *in_stack_fffffffffffffd00
  ;
  MatrixBase<Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_> *this_00;
  LhsNested in_stack_fffffffffffffd08;
  ArrayBase<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<float_(*)(float),_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>
  *in_stack_fffffffffffffd20;
  TransposeReturnType in_stack_fffffffffffffd28;
  int *in_stack_fffffffffffffd40;
  MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffd48;
  int local_16c;
  
  std::vector<Layer,_std::allocator<Layer>_>::back
            ((vector<Layer,_std::allocator<Layer>_> *)in_stack_fffffffffffffd00);
  Eigen::MatrixBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator-
            ((MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)
             in_stack_fffffffffffffd28.m_matrix,
             (MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffd20);
  std::vector<Layer,_std::allocator<Layer>_>::back
            ((vector<Layer,_std::allocator<Layer>_> *)in_stack_fffffffffffffd00);
  Eigen::Matrix<float,-1,1,0,-1,1>::operator=
            ((Matrix<float,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd00,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
              *)in_stack_fffffffffffffcf8);
  std::vector<Layer,_std::allocator<Layer>_>::back
            ((vector<Layer,_std::allocator<Layer>_> *)in_stack_fffffffffffffd00);
  std::vector<Layer,_std::allocator<Layer>_>::back
            ((vector<Layer,_std::allocator<Layer>_> *)in_stack_fffffffffffffd00);
  Eigen::MatrixBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator*
            (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>_>
  ::array((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>
           *)in_stack_fffffffffffffd08.m_matrix);
  Eigen::DenseBase<Eigen::Matrix<float,-1,1,0,-1,1>>::unaryExpr<float(*)(float)>
            ((DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffd00,
             (_func_float_float **)in_stack_fffffffffffffcf8);
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<float_(*)(float),_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>::
  array((MatrixBase<Eigen::CwiseUnaryOp<float_(*)(float),_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
         *)0x1475b5);
  Eigen::
  ArrayBase<Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::Matrix<float,-1,1,0,-1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,1,0,-1,1>const>const>const>>
  ::operator*((ArrayBase<Eigen::ArrayWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>_>
               *)in_stack_fffffffffffffd28.m_matrix,in_stack_fffffffffffffd20);
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<float_(*)(float),_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>_>_>
  ::matrix((ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<float_(*)(float),_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>_>
            *)in_stack_fffffffffffffd08.m_matrix);
  Eigen::Matrix<float,-1,1,0,-1,1>::
  Matrix<Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::Matrix<float,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const>const>const,Eigen::ArrayWrapper<Eigen::CwiseUnaryOp<float(*)(float),Eigen::Matrix<float,_1,1,0,_1,1>const>const>const>const>>
            ((Matrix<float,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd00,
             (EigenBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<float_(*)(float),_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>_>_>
              *)in_stack_fffffffffffffcf8);
  std::vector<Layer,_std::allocator<Layer>_>::back
            ((vector<Layer,_std::allocator<Layer>_> *)in_stack_fffffffffffffd00);
  Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::operator=
            ((Matrix<float,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd00,
             (Matrix<float,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffcf8);
  std::vector<Layer,_std::allocator<Layer>_>::operator[]
            ((vector<Layer,_std::allocator<Layer>_> *)(in_RDI + 10),(long)(*in_RDI + -2));
  Eigen::DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::transpose
            ((DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffcf8);
  Eigen::MatrixBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator*
            ((MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffd00,
             (MatrixBase<Eigen::Transpose<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_> *)
             in_stack_fffffffffffffcf8);
  std::vector<Layer,_std::allocator<Layer>_>::operator[]
            ((vector<Layer,_std::allocator<Layer>_> *)(in_RDI + 10),(long)(*in_RDI + -2));
  Eigen::Matrix<float,-1,-1,0,-1,-1>::operator=
            ((Matrix<float,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffd00,
             (DenseBase<Eigen::Product<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_Eigen::Transpose<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_0>_>
              *)in_stack_fffffffffffffcf8);
  std::vector<Layer,_std::allocator<Layer>_>::operator[]
            ((vector<Layer,_std::allocator<Layer>_> *)(in_RDI + 10),(long)(*in_RDI + -2));
  Eigen::DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::transpose
            ((DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffcf8);
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>>>::operator*
            (in_stack_fffffffffffffd00,
             (MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffcf8);
  std::vector<Layer,_std::allocator<Layer>_>::operator[]
            ((vector<Layer,_std::allocator<Layer>_> *)(in_RDI + 10),(long)(*in_RDI + -2));
  Eigen::Matrix<float,-1,1,0,-1,1>::operator=
            ((Matrix<float,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  PVar2.m_rhs = (RhsNested)in_stack_fffffffffffffd00;
  PVar2.m_lhs.m_matrix = in_stack_fffffffffffffd08.m_matrix;
  for (local_16c = *in_RDI + -3; -1 < local_16c; local_16c = local_16c + -1) {
    std::vector<Layer,_std::allocator<Layer>_>::operator[]
              ((vector<Layer,_std::allocator<Layer>_> *)(in_RDI + 10),(long)local_16c);
    std::vector<Layer,_std::allocator<Layer>_>::operator[]
              ((vector<Layer,_std::allocator<Layer>_> *)(in_RDI + 10),(long)(local_16c + 1));
    Eigen::MatrixBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::array
              ((MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffcf8);
    Eigen::DenseBase<Eigen::Matrix<float,-1,1,0,-1,1>>::unaryExpr<float(*)(float)>
              ((DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)PVar2.m_rhs,
               (_func_float_float **)in_stack_fffffffffffffcf8);
    Eigen::
    MatrixBase<Eigen::CwiseUnaryOp<float_(*)(float),_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
    ::array((MatrixBase<Eigen::CwiseUnaryOp<float_(*)(float),_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
             *)0x147886);
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<float,-1,1,0,-1,1>>>::operator*
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_> *)
               in_stack_fffffffffffffd28.m_matrix,in_stack_fffffffffffffd20);
    Eigen::
    ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<float_(*)(float),_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>_>_>
    ::matrix((ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<float_(*)(float),_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>_>
              *)PVar2.m_lhs.m_matrix.m_matrix);
    Eigen::Matrix<float,-1,1,0,-1,1>::
    Matrix<Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::ArrayWrapper<Eigen::Matrix<float,_1,1,0,_1,1>>const,Eigen::ArrayWrapper<Eigen::CwiseUnaryOp<float(*)(float),Eigen::Matrix<float,_1,1,0,_1,1>const>const>const>const>>
              (PVar2.m_rhs,
               (EigenBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<float_(*)(float),_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>_>_>
                *)in_stack_fffffffffffffcf8);
    Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::operator=
              (PVar2.m_rhs,(Matrix<float,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffcf8);
    in_stack_fffffffffffffd28 =
         Eigen::DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::transpose
                   ((DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffcf8);
    PVar1 = Eigen::MatrixBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator*
                      ((MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)PVar2.m_rhs,
                       (MatrixBase<Eigen::Transpose<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_> *)
                       in_stack_fffffffffffffcf8);
    in_stack_fffffffffffffd20 =
         (ArrayBase<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<float_(*)(float),_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>
          *)PVar1.m_lhs;
    Eigen::Matrix<float,-1,-1,0,-1,-1>::operator=
              ((Matrix<float,__1,__1,_0,__1,__1> *)PVar2.m_rhs,
               (DenseBase<Eigen::Product<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_Eigen::Transpose<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_0>_>
                *)in_stack_fffffffffffffcf8);
    this_00 = (MatrixBase<Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_> *)PVar2.m_rhs
    ;
    if (local_16c != 0) {
      Eigen::DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::transpose
                ((DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffcf8);
      PVar2 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>>>::operator*
                        (this_00,(MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)
                                 in_stack_fffffffffffffcf8);
      Eigen::Matrix<float,-1,1,0,-1,1>::operator=(PVar2.m_rhs,in_stack_fffffffffffffcf8);
    }
    Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<float,__1,_1,_0,__1,_1> *)0x147a60);
  }
  Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<float,__1,_1,_0,__1,_1> *)0x147a83);
  return;
}

Assistant:

void NeuralNetwork::backPropagation(const Eigen::VectorXf& y) {
    using namespace std;
    using namespace Eigen;
    this->layers_.back().loss = (y - this->layers_.back().output);
    VectorXf& lastOutput = this->layers_.back().output;  //输出层的输出
    // temp就是损失对输出层偏置的梯度，同时，在求损失对权重的偏导，和损失对上一层输出的偏导时，也要乘以这个
    Eigen::VectorXf temp = ((this->layers_.back().loss * (-2)).array() *
                            (lastOutput.unaryExpr(this->deriveActivateFunc_).array()))
                               .matrix();
    // cout << temp.rows() << endl;

    this->layers_.back().biasGrads = temp;
    this->layers_[layerCount_ - 2].weightGrads =
        temp * (this->layers_[layerCount_ - 2].output.transpose());
    this->layers_[layerCount_ - 2].loss = this->layers_[layerCount_ - 2].weights.transpose() * temp;
    for (int i = layerCount_ - 3; i >= 0; --i) {
        auto& layer = this->layers_[i];
        auto& nextLayer = this->layers_[i + 1];
        Eigen::VectorXf temp1 = ((nextLayer.loss).array() *
                                 (nextLayer.output.unaryExpr(this->deriveActivateFunc_).array()))
                                    .matrix();
        nextLayer.biasGrads = temp1;
        layer.weightGrads = temp1 * (layer.output.transpose());
        if (i != 0)
            layer.loss = layer.weights.transpose() * temp1;
    }
}